

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_writer.cpp
# Opt level: O0

string * __thiscall
duckdb::FixedDecimalStatistics::GetMaxValue_abi_cxx11_(FixedDecimalStatistics *this)

{
  ulong uVar1;
  long *in_RSI;
  string *in_RDI;
  hugeint_t *in_stack_00000030;
  FixedDecimalStatistics *in_stack_00000038;
  
  uVar1 = (**(code **)(*in_RSI + 0x10))();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string(in_RDI);
  }
  else {
    GetStats_abi_cxx11_(in_stack_00000038,in_stack_00000030);
  }
  return in_RDI;
}

Assistant:

string GetMaxValue() override {
		return HasStats() ? GetStats(max) : string();
	}